

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_sub_module(lys_module *module,unres_schema *unres,lys_node *node)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint dev_size;
  uint aug_size;
  uint erase_nodes;
  uint erase_identities;
  uint i;
  lys_node *node_local;
  unres_schema *unres_local;
  lys_module *module_local;
  
  bVar3 = true;
  bVar4 = true;
  bVar1 = module->augment_size;
  module->augment_size = '\0';
  bVar2 = module->deviation_size;
  module->deviation_size = '\0';
  iVar5 = yang_check_typedef(module,(lys_node *)0x0,unres);
  if ((iVar5 == 0) &&
     (iVar5 = yang_check_ext_instance(module,&module->ext,(uint)module->ext_size,module,unres),
     iVar5 == 0)) {
    for (erase_nodes = 0; erase_nodes < module->rev_size; erase_nodes = erase_nodes + 1) {
      iVar5 = yang_check_ext_instance
                        (module,&module->rev[erase_nodes].ext,
                         (uint)module->rev[erase_nodes].ext_size,module->rev + erase_nodes,unres);
      if (iVar5 != 0) goto LAB_0017348e;
    }
    for (erase_nodes = 0; erase_nodes < module->extensions_size; erase_nodes = erase_nodes + 1) {
      iVar5 = yang_check_ext_instance
                        (module,&module->extensions[erase_nodes].ext,
                         (uint)module->extensions[erase_nodes].ext_size,
                         module->extensions + erase_nodes,unres);
      if (iVar5 != 0) goto LAB_0017348e;
    }
    for (erase_nodes = 0; erase_nodes < module->features_size; erase_nodes = erase_nodes + 1) {
      iVar5 = yang_check_iffeatures
                        (module,(void *)0x0,module->features + erase_nodes,FEATURE_KEYWORD,unres);
      if (((iVar5 != 0) ||
          (iVar5 = yang_check_ext_instance
                             (module,&module->features[erase_nodes].ext,
                              (uint)module->features[erase_nodes].ext_size,
                              module->features + erase_nodes,unres), iVar5 != 0)) ||
         ((module->features[erase_nodes].iffeature_size != '\0' &&
          (iVar5 = unres_schema_add_node
                             (module,unres,module->features + erase_nodes,UNRES_FEATURE,
                              (lys_node *)0x0), iVar5 == -1)))) goto LAB_0017348e;
    }
    bVar3 = false;
    iVar5 = yang_check_identities(module,unres);
    if (iVar5 == 0) {
      bVar4 = false;
      iVar5 = yang_check_nodes(module,(lys_node *)0x0,node,0,unres);
      if (iVar5 == 0) {
        for (erase_nodes = 0; erase_nodes < bVar2; erase_nodes = erase_nodes + 1) {
          module->deviation_size = module->deviation_size + '\x01';
          iVar5 = yang_check_deviation(module,unres,module->deviation + erase_nodes);
          if (iVar5 != 0) goto LAB_0017348e;
        }
        erase_nodes = 0;
        while( true ) {
          if (bVar1 <= erase_nodes) {
            return 0;
          }
          module->augment_size = module->augment_size + '\x01';
          iVar5 = yang_check_augment(module,module->augment + erase_nodes,0,unres);
          if ((iVar5 != 0) ||
             (iVar5 = unres_schema_add_node
                                (module,unres,module->augment + erase_nodes,UNRES_AUGMENT,
                                 (lys_node *)0x0), iVar5 == -1)) break;
          erase_nodes = erase_nodes + 1;
        }
      }
    }
  }
LAB_0017348e:
  if (bVar3) {
    yang_free_ident_base(module->ident,0,(uint)module->ident_size);
  }
  if (bVar4) {
    yang_free_nodes(module->ctx,node);
  }
  for (erase_nodes = (uint)module->augment_size; erase_nodes < bVar1; erase_nodes = erase_nodes + 1)
  {
    yang_free_augment(module->ctx,module->augment + erase_nodes);
  }
  for (erase_nodes = (uint)module->deviation_size; erase_nodes < bVar2;
      erase_nodes = erase_nodes + 1) {
    yang_free_deviate(module->ctx,module->deviation + erase_nodes,0);
    free(module->deviation[erase_nodes].deviate);
  }
  return 1;
}

Assistant:

static int
yang_check_sub_module(struct lys_module *module, struct unres_schema *unres, struct lys_node *node)
{
    uint i, erase_identities = 1, erase_nodes = 1, aug_size, dev_size = 0;

    aug_size = module->augment_size;
    module->augment_size = 0;
    dev_size = module->deviation_size;
    module->deviation_size = 0;

    if (yang_check_typedef(module, NULL, unres)) {
        goto error;
    }

    if (yang_check_ext_instance(module, &module->ext, module->ext_size, module, unres)) {
        goto error;
    }

    /* check extension in revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (yang_check_ext_instance(module, &module->rev[i].ext, module->rev[i].ext_size, &module->rev[i], unres)) {
            goto error;
        }
    }

    /* check extension in definition of extension */
    for (i = 0; i < module->extensions_size; ++i) {
        if (yang_check_ext_instance(module, &module->extensions[i].ext, module->extensions[i].ext_size, &module->extensions[i], unres)) {
            goto error;
        }
    }

    /* check features */
    for (i = 0; i < module->features_size; ++i) {
        if (yang_check_iffeatures(module, NULL, &module->features[i], FEATURE_KEYWORD, unres)) {
            goto error;
        }
        if (yang_check_ext_instance(module, &module->features[i].ext, module->features[i].ext_size, &module->features[i], unres)) {
            goto error;
        }

        /* check for circular dependencies */
        if (module->features[i].iffeature_size && (unres_schema_add_node(module, unres, &module->features[i], UNRES_FEATURE, NULL) == -1)) {
            goto error;
        }
    }
    erase_identities = 0;
    if (yang_check_identities(module, unres)) {
        goto error;
    }
    erase_nodes = 0;
    if (yang_check_nodes(module, NULL, node, 0, unres)) {
        goto error;
    }

    /* check deviation */
    for (i = 0; i < dev_size; ++i) {
        module->deviation_size++;
        if (yang_check_deviation(module, unres, &module->deviation[i])) {
            goto error;
        }
    }

    /* check augments */
    for (i = 0; i < aug_size; ++i) {
        module->augment_size++;
        if (yang_check_augment(module, &module->augment[i], 0, unres)) {
            goto error;
        }
        if (unres_schema_add_node(module, unres, &module->augment[i], UNRES_AUGMENT, NULL) == -1) {
            goto error;
        }
    }

    return EXIT_SUCCESS;
error:
    if (erase_identities) {
        yang_free_ident_base(module->ident, 0, module->ident_size);
    }
    if (erase_nodes) {
        yang_free_nodes(module->ctx, node);
    }
    for (i = module->augment_size; i < aug_size; ++i) {
        yang_free_augment(module->ctx, &module->augment[i]);
    }
    for (i = module->deviation_size; i < dev_size; ++i) {
        yang_free_deviate(module->ctx, &module->deviation[i], 0);
        free(module->deviation[i].deviate);
    }
    return EXIT_FAILURE;
}